

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O3

lua_State * luaE_newthread(lua_State *L)

{
  int iVar1;
  GCObject *o;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0xb8);
  luaC_link(L,o,'\b');
  (o->h).node = (Node *)L->l_G;
  (o->p).source = (TString *)0x0;
  (o->p).sizep = 0;
  (o->th).errorJmp = (lua_longjmp *)0x0;
  (o->th).errfunc = 0;
  *(undefined2 *)&(o->p).lastlinedefined = 0x100;
  (o->p).gclist = (GCObject *)0x0;
  (o->th).hook = (lua_Hook)0x0;
  (o->th).openupval = (GCObject *)0x0;
  (o->h).flags = '\0';
  (o->th).base_ci = (CallInfo *)0x0;
  (o->th).l_gt.tt = 0;
  (o->h).lastfree = (Node *)0x0;
  (o->h).gclist = (GCObject *)0x0;
  *(int *)((long)o + 0x5c) = 0;
  *(int *)((long)o + 0x60) = 0;
  stack_init(&o->th,L);
  (o->th).l_gt.value = (L->l_gt).value;
  (o->th).l_gt.tt = (L->l_gt).tt;
  (o->th).hookmask = L->hookmask;
  iVar1 = L->basehookcount;
  (o->th).basehookcount = iVar1;
  (o->th).hook = L->hook;
  (o->th).hookcount = iVar1;
  return (lua_State *)o;
}

Assistant:

lua_State *luaE_newthread (lua_State *L) {
  lua_State *L1 = tostate(luaM_malloc(L, state_size(lua_State)));
  luaC_link(L, obj2gco(L1), LUA_TTHREAD);
  preinit_state(L1, G(L));
  stack_init(L1, L);  /* init stack */
  setobj2n(L, gt(L1), gt(L));  /* share table of globals */
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  lua_assert(iswhite(obj2gco(L1)));
  return L1;
}